

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool DockNodeIsDropAllowedOne(ImGuiWindow *payload,ImGuiWindow *host_window)

{
  ImGuiID IVar1;
  ImGuiID IVar2;
  ImGuiDockNode *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiPopupData *pIVar6;
  ImGuiWindowClass *pIVar7;
  ImVector<ImGuiPopupData> *this;
  int i;
  
  pIVar3 = host_window->DockNodeAsHost;
  if (((pIVar3 == (ImGuiDockNode *)0x0) || ((pIVar3->MergedFlags & 0x400) == 0)) ||
     (host_window->BeginOrderWithinContext <= payload->BeginOrderWithinContext)) {
    pIVar7 = &host_window->WindowClass;
    if (pIVar3 != (ImGuiDockNode *)0x0) {
      pIVar7 = &pIVar3->WindowClass;
    }
    IVar1 = pIVar7->ClassId;
    IVar2 = (payload->WindowClass).ClassId;
    if (IVar1 == IVar2) {
      i = (GImGui->OpenPopupStack).Size;
      this = &GImGui->OpenPopupStack;
      do {
        bVar4 = i < 1;
        if (i < 1) {
          return bVar4;
        }
        i = i + -1;
        pIVar6 = ImVector<ImGuiPopupData>::operator[](this,i);
      } while ((pIVar6->Window == (ImGuiWindow *)0x0) ||
              (bVar5 = ImGui::IsWindowWithinBeginStackOf(payload,pIVar6->Window), !bVar5));
      return bVar4;
    }
    if (((IVar1 != 0) && (IVar2 == 0)) && (pIVar7->DockingAllowUnclassed != false)) {
      return true;
    }
    if (((IVar2 != 0) && (IVar1 == 0)) && ((payload->WindowClass).DockingAllowUnclassed != false)) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool DockNodeIsDropAllowedOne(ImGuiWindow* payload, ImGuiWindow* host_window)
{
    if (host_window->DockNodeAsHost && host_window->DockNodeAsHost->IsDockSpace() && payload->BeginOrderWithinContext < host_window->BeginOrderWithinContext)
        return false;

    ImGuiWindowClass* host_class = host_window->DockNodeAsHost ? &host_window->DockNodeAsHost->WindowClass : &host_window->WindowClass;
    ImGuiWindowClass* payload_class = &payload->WindowClass;
    if (host_class->ClassId != payload_class->ClassId)
    {
        if (host_class->ClassId != 0 && host_class->DockingAllowUnclassed && payload_class->ClassId == 0)
            return true;
        if (payload_class->ClassId != 0 && payload_class->DockingAllowUnclassed && host_class->ClassId == 0)
            return true;
        return false;
    }

    // Prevent docking any window created above a popup
    // Technically we should support it (e.g. in the case of a long-lived modal window that had fancy docking features),
    // by e.g. adding a 'if (!ImGui::IsWindowWithinBeginStackOf(host_window, popup_window))' test.
    // But it would requires more work on our end because the dock host windows is technically created in NewFrame()
    // and our ->ParentXXX and ->RootXXX pointers inside windows are currently mislading or lacking.
    ImGuiContext& g = *GImGui;
    for (int i = g.OpenPopupStack.Size - 1; i >= 0; i--)
        if (ImGuiWindow* popup_window = g.OpenPopupStack[i].Window)
            if (ImGui::IsWindowWithinBeginStackOf(payload, popup_window))   // Payload is created from within a popup begin stack.
                return false;

    return true;
}